

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reconinter_enc.c
# Opt level: O2

void av1_build_prediction_by_above_preds
               (AV1_COMMON *cm,MACROBLOCKD *xd,uint8_t **tmp_buf,int *tmp_width,int *tmp_height,
               int *tmp_stride)

{
  uint8_t uVar1;
  undefined1 uVar2;
  int iVar3;
  uint uVar4;
  MB_MODE_INFO **ppMVar5;
  MB_MODE_INFO *above_mbmi;
  long lVar6;
  byte op_mi_size;
  long lVar7;
  byte bVar8;
  long lVar9;
  uint uVar10;
  uint uVar11;
  int iVar12;
  int iVar13;
  build_prediction_ctxt ctxt;
  
  if (xd->up_available == true) {
    ctxt.mb_to_far_edge = xd->mb_to_right_edge;
    ctxt.dcb = (void *)0x0;
    ppMVar5 = xd->mi;
    iVar3 = max_neighbor_obmc[""[(*ppMVar5)->bsize]];
    uVar1 = cm->seq_params->monochrome;
    uVar4 = xd->mi_col;
    lVar9 = (long)(int)uVar4;
    lVar7 = (long)xd->mi_stride;
    iVar13 = xd->width + uVar4;
    iVar12 = (cm->mi_params).mi_cols;
    if (iVar12 <= iVar13) {
      iVar13 = iVar12;
    }
    iVar12 = 0;
    uVar10 = uVar4;
    ctxt.cm = cm;
    ctxt.tmp_buf = tmp_buf;
    ctxt.tmp_width = tmp_width;
    ctxt.tmp_height = tmp_height;
    ctxt.tmp_stride = tmp_stride;
    while (((int)uVar10 < iVar13 && (iVar12 < iVar3))) {
      bVar8 = 0x10;
      if ((0x1f07ffUL >> ((ulong)ppMVar5[((int)uVar10 - lVar7) - lVar9]->bsize & 0x3f) & 1) != 0) {
        bVar8 = "\x01\x01\x02\x02\x02\x04\x04\x04\b\b\b\x10\x10\x10  \x01\x04\x02\b\x04\x10"
                [ppMVar5[((int)uVar10 - lVar7) - lVar9]->bsize];
      }
      lVar6 = ((int)uVar10 - lVar7) - lVar9;
      uVar11 = uVar10 & 0xfffffffe;
      if (bVar8 == 1) {
        bVar8 = 2;
        uVar10 = uVar11;
        lVar6 = (((long)(int)uVar11 + 1) - lVar7) - lVar9;
      }
      above_mbmi = ppMVar5[lVar6];
      if (((above_mbmi->field_0xa7 & 0x80) != 0) || ('\0' < above_mbmi->ref_frame[0])) {
        iVar12 = iVar12 + 1;
        uVar2 = xd->width;
        op_mi_size = uVar2;
        if (bVar8 <= (byte)uVar2) {
          op_mi_size = bVar8;
        }
        build_obmc_prediction
                  (xd,0,uVar10 - uVar4,op_mi_size,0,above_mbmi,&ctxt,(uint)(uVar1 == '\0') * 2 + 1);
      }
      uVar10 = uVar10 + bVar8;
    }
  }
  return;
}

Assistant:

void av1_build_prediction_by_above_preds(const AV1_COMMON *cm, MACROBLOCKD *xd,
                                         uint8_t *tmp_buf[MAX_MB_PLANE],
                                         int tmp_width[MAX_MB_PLANE],
                                         int tmp_height[MAX_MB_PLANE],
                                         int tmp_stride[MAX_MB_PLANE]) {
  if (!xd->up_available) return;
  struct build_prediction_ctxt ctxt = {
    cm, tmp_buf, tmp_width, tmp_height, tmp_stride, xd->mb_to_right_edge, NULL
  };
  BLOCK_SIZE bsize = xd->mi[0]->bsize;
  foreach_overlappable_nb_above(cm, xd,
                                max_neighbor_obmc[mi_size_wide_log2[bsize]],
                                build_obmc_prediction, &ctxt);
}